

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void avgFinalize(sqlite3_context *context)

{
  sqlite3_context *pCtx;
  SumCtx *p;
  sqlite3_context *in_stack_ffffffffffffffe8;
  
  pCtx = (sqlite3_context *)sqlite3_aggregate_context(in_stack_ffffffffffffffe8,0);
  if ((pCtx != (sqlite3_context *)0x0) && (0 < (long)pCtx->pMem)) {
    sqlite3_result_double(pCtx,(double)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void avgFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    sqlite3_result_double(context, p->rSum/(double)p->cnt);
  }
}